

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::internal::UnitTestImpl::ConfigureStreamingOutput(UnitTestImpl *this)

{
  long lVar1;
  StreamingListener *this_00;
  string local_60;
  string local_40;
  
  if (_DAT_001765f0 != 0) {
    lVar1 = std::__cxx11::string::find(-0x18,0x3a);
    if (lVar1 == -1) {
      printf("WARNING: unrecognized streaming target \"%s\" ignored.\n",
             FLAGS_gtest_stream_result_to_abi_cxx11_);
      fflush(_stdout);
      return;
    }
    this_00 = (StreamingListener *)operator_new(0x10);
    std::__cxx11::string::substr((ulong)&local_40,0x1765e8);
    std::__cxx11::string::substr((ulong)&local_60,0x1765e8);
    StreamingListener::StreamingListener(this_00,&local_40,&local_60);
    TestEventListeners::Append(&this->listeners_,(TestEventListener *)this_00);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

std::string GetBoolAssertionFailureMessage(
    const AssertionResult& assertion_result,
    const char* expression_text,
    const char* actual_predicate_value,
    const char* expected_predicate_value) {
  const char* actual_message = assertion_result.message();
  Message msg;
  msg << "Value of: " << expression_text
      << "\n  Actual: " << actual_predicate_value;
  if (actual_message[0] != '\0')
    msg << " (" << actual_message << ")";
  msg << "\nExpected: " << expected_predicate_value;
  return msg.GetString();
}